

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

void __thiscall leveldb::DBImpl::CompactMemTable(DBImpl *this)

{
  Version *this_00;
  undefined1 auVar1 [8];
  Status s;
  VersionEdit edit;
  undefined1 local_100 [8];
  undefined1 local_f8 [40];
  undefined1 local_d0 [16];
  undefined1 local_c0 [49];
  bool local_8f;
  bool local_8e;
  pointer local_88;
  pointer ppStack_80;
  VersionSet *local_78;
  _Rb_tree_color local_68 [2];
  _Base_ptr local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  TableCache *local_48;
  pointer ppStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (this->imm_ == (MemTable *)0x0) {
    __assert_fail("imm_ != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x222,"void leveldb::DBImpl::CompactMemTable()");
  }
  local_d0._0_8_ = local_c0;
  local_d0._8_8_ = (Version *)0x0;
  local_c0[0] = '\0';
  local_88 = (pointer)0x0;
  ppStack_80 = (pointer)0x0;
  local_78 = (VersionSet *)0x0;
  local_58._M_allocated_capacity = (size_type)local_68;
  local_68[0] = _S_red;
  local_60 = (_Base_ptr)0x0;
  local_48 = (TableCache *)0x0;
  ppStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  uStack_30 = (pointer)0x0;
  local_58._8_8_ = local_58._M_allocated_capacity;
  VersionEdit::Clear((VersionEdit *)local_d0);
  this_00 = this->versions_->current_;
  Version::Ref(this_00);
  WriteLevel0Table((DBImpl *)local_100,(MemTable *)this,(VersionEdit *)this->imm_,
                   (Version *)local_d0);
  Version::Unref(this_00);
  if (local_100 == (undefined1  [8])0x0) {
    if (((this->shutting_down_)._M_base._M_i & 1U) != 0) {
      local_f8._0_8_ = "Deleting DB during memtable compaction";
      local_f8._8_8_ = (_func_int **)0x26;
      local_f8._24_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
      local_f8._32_8_ = (FilterPolicy *)0x0;
      Status::Status((Status *)(local_f8 + 0x10),kIOError,(Slice *)local_f8,
                     (Slice *)(local_f8 + 0x18));
      auVar1 = local_100;
      local_100 = (undefined1  [8])local_f8._16_8_;
      local_f8._16_8_ = auVar1;
      if (auVar1 != (undefined1  [8])0x0) {
        operator_delete__((void *)auVar1);
      }
    }
    if (local_100 == (undefined1  [8])0x0) {
      local_8e = true;
      local_c0._24_8_ = (pointer)0x0;
      local_c0._16_8_ = this->logfile_number_;
      local_8f = true;
      VersionSet::LogAndApply
                ((VersionSet *)local_f8,(VersionEdit *)this->versions_,(Mutex *)local_d0);
      auVar1 = local_100;
      local_100 = (undefined1  [8])local_f8._0_8_;
      local_f8._0_8_ = auVar1;
      if (auVar1 != (undefined1  [8])0x0) {
        operator_delete__((void *)auVar1);
      }
      if (local_100 == (undefined1  [8])0x0) {
        MemTable::Unref(this->imm_);
        this->imm_ = (MemTable *)0x0;
        (this->has_imm_)._M_base._M_i = false;
        RemoveObsoleteFiles(this);
        goto LAB_00112c5b;
      }
    }
  }
  RecordBackgroundError(this,(Status *)local_100);
LAB_00112c5b:
  if (local_100 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_100);
  }
  VersionEdit::~VersionEdit((VersionEdit *)local_d0);
  return;
}

Assistant:

void DBImpl::CompactMemTable() {
  mutex_.AssertHeld();
  assert(imm_ != nullptr);

  // Save the contents of the memtable as a new Table
  VersionEdit edit;
  Version* base = versions_->current();
  base->Ref();
  Status s = WriteLevel0Table(imm_, &edit, base);
  base->Unref();

  if (s.ok() && shutting_down_.load(std::memory_order_acquire)) {
    s = Status::IOError("Deleting DB during memtable compaction");
  }

  // Replace immutable memtable with the generated Table
  if (s.ok()) {
    edit.SetPrevLogNumber(0);
    edit.SetLogNumber(logfile_number_);  // Earlier logs no longer needed
    s = versions_->LogAndApply(&edit, &mutex_);
  }

  if (s.ok()) {
    // Commit to the new state
    imm_->Unref();
    imm_ = nullptr;
    has_imm_.store(false, std::memory_order_release);
    RemoveObsoleteFiles();
  } else {
    RecordBackgroundError(s);
  }
}